

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void connectWarning(QObject *sender,QMetaObject *senderMetaObject,QObject *receiver,char *message)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  undefined4 extraout_var_00;
  char *pcVar3;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (sender == (QObject *)0x0) {
    if (senderMetaObject == (QMetaObject *)0x0) {
      pcVar2 = "Unknown";
      goto LAB_002b799d;
    }
  }
  else {
    iVar1 = (**sender->_vptr_QObject)();
    senderMetaObject = (QMetaObject *)CONCAT44(extraout_var,iVar1);
  }
  pcVar2 = QMetaObject::className(senderMetaObject);
LAB_002b799d:
  if (receiver == (QObject *)0x0) {
    pcVar3 = "Unknown";
  }
  else {
    iVar1 = (**receiver->_vptr_QObject)(receiver);
    pcVar3 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_00,iVar1));
  }
  lcConnect();
  if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
    local_40.context.version = 2;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.function._4_4_ = 0;
    local_40.context.category = lcConnect::category.name;
    QMessageLogger::warning(&local_40,"QObject::connect(%s, %s): %s",pcVar2,pcVar3,message);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void connectWarning(const QObject *sender,
                           const QMetaObject *senderMetaObject,
                           const QObject *receiver,
                           const char *message)
{
    const char *senderString = sender ? sender->metaObject()->className()
                                      : senderMetaObject ? senderMetaObject->className()
                                      : "Unknown";
    const char *receiverString = receiver ? receiver->metaObject()->className()
                                          : "Unknown";
    qCWarning(lcConnect, "QObject::connect(%s, %s): %s", senderString, receiverString, message);
}